

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11authfile.c
# Opt level: O3

void x11_get_auth_from_authfile(X11Display *disp,char *authfilename)

{
  BinarySource *pBVar1;
  _Bool _Var2;
  _Bool _Var3;
  uint uVar4;
  FILE *__stream;
  char *str;
  void *__ptr;
  size_t sVar5;
  char *__nptr;
  uchar *puVar6;
  size_t factor1;
  long lVar7;
  int iVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  ptrlen pl;
  ptrlen pVar11;
  ptrlen pVar12;
  BinarySource src [1];
  char buf [4];
  int *local_a0;
  size_t local_98;
  BinarySource local_78;
  undefined4 local_48;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  if (disp->unixdomain == false) {
    _Var2 = sk_address_is_local(disp->addr);
  }
  else {
    _Var2 = false;
  }
  __stream = fopen(authfilename,"rb");
  if (__stream == (FILE *)0x0) {
    return;
  }
  str = get_hostname();
  __ptr = safemalloc(0x8000c,1,0);
  sVar5 = fread(__ptr,1,0x8000c,__stream);
  local_78.len = (size_t)(int)sVar5;
  local_78.binarysource_ = &local_78;
  local_78.pos = 0;
  local_78.err = BSE_NO_ERROR;
  local_78.data = __ptr;
  do {
    do {
      if (0x40005 < local_78.pos) {
        iVar8 = (int)sVar5 - (int)local_78.pos;
        sVar5 = (size_t)iVar8;
        memcpy(__ptr,(void *)(local_78.pos + (long)__ptr),sVar5);
        sVar5 = fread((void *)((long)__ptr + sVar5),1,0x8000c - sVar5,__stream);
        uVar9 = iVar8 + (int)sVar5;
        sVar5 = (size_t)uVar9;
        local_78.len = (size_t)(int)uVar9;
        local_78.pos = 0;
        local_78.err = BSE_NO_ERROR;
        local_78.binarysource_ = &local_78;
        local_78.data = __ptr;
      }
      uVar9 = BinarySource_get_uint16(local_78.binarysource_);
      pBVar1 = local_78.binarysource_;
      uVar4 = BinarySource_get_uint16((local_78.binarysource_)->binarysource_);
      pl = BinarySource_get_data(pBVar1->binarysource_,(ulong)uVar4);
      pBVar1 = local_78.binarysource_;
      uVar4 = BinarySource_get_uint16((local_78.binarysource_)->binarysource_);
      pVar11 = BinarySource_get_data(pBVar1->binarysource_,(ulong)uVar4);
      __nptr = mkstr(pVar11);
      if (*__nptr == '\0') {
        iVar8 = -1;
      }
      else {
        iVar8 = atoi(__nptr);
      }
      safefree(__nptr);
      pBVar1 = local_78.binarysource_;
      uVar4 = BinarySource_get_uint16((local_78.binarysource_)->binarysource_);
      pVar11 = BinarySource_get_data(pBVar1->binarysource_,(ulong)uVar4);
      pBVar1 = local_78.binarysource_;
      uVar4 = BinarySource_get_uint16((local_78.binarysource_)->binarysource_);
      pVar12 = BinarySource_get_data(pBVar1->binarysource_,(ulong)uVar4);
      factor1 = pVar12.len;
      if ((local_78.binarysource_)->err != BSE_NO_ERROR) {
LAB_001650ca:
        fclose(__stream);
        smemclr(__ptr,0x8000c);
        safefree(__ptr);
        safefree(str);
        return;
      }
    } while ((disp->displaynum < 0) || (-1 < iVar8 && disp->displaynum != iVar8));
    lVar7 = 1;
    do {
      _Var3 = ptrlen_eq_string(pVar11,x11_authnames[lVar7]);
      if (_Var3) {
        if (uVar9 == 0x100) {
          if (disp->unixdomain == false) {
            if ((str != (char *)0x0 & _Var2) == 0) break;
          }
          else if (str == (char *)0x0) break;
          _Var3 = ptrlen_eq_string(pl,str);
          if (_Var3) {
            disp->localauthproto = (int)lVar7;
            safefree(disp->localauthdata);
            puVar6 = (uchar *)safemalloc(factor1,1,0);
            disp->localauthdata = puVar6;
            memcpy(puVar6,pVar12.ptr,factor1);
            disp->localauthdatalen = (int)pVar12.len;
            goto LAB_001650ca;
          }
        }
        else {
          local_a0 = (int *)pl.ptr;
          local_98 = pl.len;
          if (uVar9 == 6) {
            if (((disp->unixdomain != false) || (iVar8 = sk_addrtype(disp->addr), iVar8 != 2)) ||
               (sk_addrcopy(disp->addr,(char *)&local_48), local_98 != 0x10)) break;
            auVar10[0] = -((char)*local_a0 == (char)local_48);
            auVar10[1] = -(*(char *)((long)local_a0 + 1) == local_48._1_1_);
            auVar10[2] = -(*(char *)((long)local_a0 + 2) == local_48._2_1_);
            auVar10[3] = -(*(char *)((long)local_a0 + 3) == local_48._3_1_);
            auVar10[4] = -((char)local_a0[1] == cStack_44);
            auVar10[5] = -(*(char *)((long)local_a0 + 5) == cStack_43);
            auVar10[6] = -(*(char *)((long)local_a0 + 6) == cStack_42);
            auVar10[7] = -(*(char *)((long)local_a0 + 7) == cStack_41);
            auVar10[8] = -((char)local_a0[2] == cStack_40);
            auVar10[9] = -(*(char *)((long)local_a0 + 9) == cStack_3f);
            auVar10[10] = -(*(char *)((long)local_a0 + 10) == cStack_3e);
            auVar10[0xb] = -(*(char *)((long)local_a0 + 0xb) == cStack_3d);
            auVar10[0xc] = -((char)local_a0[3] == cStack_3c);
            auVar10[0xd] = -(*(char *)((long)local_a0 + 0xd) == cStack_3b);
            auVar10[0xe] = -(*(char *)((long)local_a0 + 0xe) == cStack_3a);
            auVar10[0xf] = -(*(char *)((long)local_a0 + 0xf) == cStack_39);
            if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar10[0xf] >> 7) << 0xf) != 0xffff) break;
          }
          else if (((uVar9 != 0) || (disp->unixdomain != false)) ||
                  ((iVar8 = sk_addrtype(disp->addr), iVar8 != 1 ||
                   ((sk_addrcopy(disp->addr,(char *)&local_48), local_98 != 4 ||
                    (*local_a0 != local_48)))))) break;
          disp->localauthproto = (int)lVar7;
          safefree(disp->localauthdata);
          puVar6 = (uchar *)safemalloc(factor1,1,0);
          disp->localauthdata = puVar6;
          memcpy(puVar6,pVar12.ptr,factor1);
          disp->localauthdatalen = (int)pVar12.len;
          if (_Var2 == false) goto LAB_001650ca;
        }
        break;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
  } while( true );
}

Assistant:

void x11_get_auth_from_authfile(struct X11Display *disp,
                                const char *authfilename)
{
    FILE *authfp;
    char *buf;
    int size;
    BinarySource src[1];
    int family, protocol;
    ptrlen addr, protoname, data;
    char *displaynum_string;
    int displaynum;
    bool ideal_match = false;
    char *ourhostname;

    /* A maximally sized (wildly implausible) .Xauthority record
     * consists of a 16-bit integer to start with, then four strings,
     * each of which has a 16-bit length field followed by that many
     * bytes of data (i.e. up to 0xFFFF bytes). */
    const size_t MAX_RECORD_SIZE = 2 + 4 * (2+0xFFFF);

    /* We'll want a buffer of twice that size (see below). */
    const size_t BUF_SIZE = 2 * MAX_RECORD_SIZE;

    /*
     * Normally we should look for precisely the details specified in
     * `disp'. However, there's an oddity when the display is local:
     * displays like "localhost:0" usually have their details stored
     * in a Unix-domain-socket record (even if there isn't actually a
     * real Unix-domain socket available, as with OpenSSH's proxy X11
     * server).
     *
     * This is apparently a fudge to get round the meaninglessness of
     * "localhost" in a shared-home-directory context -- xauth entries
     * for Unix-domain sockets already disambiguate this by storing
     * the *local* hostname in the conveniently-blank hostname field,
     * but IP "localhost" records couldn't do this. So, typically, an
     * IP "localhost" entry in the auth database isn't present and if
     * it were it would be ignored.
     *
     * However, we don't entirely trust that (say) Windows X servers
     * won't rely on a straight "localhost" entry, bad idea though
     * that is; so if we can't find a Unix-domain-socket entry we'll
     * fall back to an IP-based entry if we can find one.
     */
    bool localhost = !disp->unixdomain && sk_address_is_local(disp->addr);

    authfp = fopen(authfilename, "rb");
    if (!authfp)
        return;

    ourhostname = get_hostname();

    /*
     * Allocate enough space to hold two maximally sized records, so
     * that a full record can start anywhere in the first half. That
     * way we avoid the accidentally-quadratic algorithm that would
     * arise if we moved everything to the front of the buffer after
     * consuming each record; instead, we only move everything to the
     * front after our current position gets past the half-way mark.
     * Before then, there's no need to move anyway; so this guarantees
     * linear time, in that every byte written into this buffer moves
     * at most once (because every move is from the second half of the
     * buffer to the first half).
     */
    buf = snewn(BUF_SIZE, char);
    size = fread(buf, 1, BUF_SIZE, authfp);
    BinarySource_BARE_INIT(src, buf, size);

    while (!ideal_match) {
        bool match = false;

        if (src->pos >= MAX_RECORD_SIZE) {
            size -= src->pos;
            memcpy(buf, buf + src->pos, size);
            size += fread(buf + size, 1, BUF_SIZE - size, authfp);
            BinarySource_BARE_INIT(src, buf, size);
        }

        family = get_uint16(src);
        addr = get_string_xauth(src);
        displaynum_string = mkstr(get_string_xauth(src));
        displaynum = displaynum_string[0] ? atoi(displaynum_string) : -1;
        sfree(displaynum_string);
        protoname = get_string_xauth(src);
        data = get_string_xauth(src);
        if (get_err(src))
            break;

        /*
         * Now we have a full X authority record in memory. See
         * whether it matches the display we're trying to
         * authenticate to.
         *
         * The details we've just read should be interpreted as
         * follows:
         *
         *  - 'family' is the network address family used to
         *    connect to the display. 0 means IPv4; 6 means IPv6;
         *    256 means Unix-domain sockets.
         *
         *  - 'addr' is the network address itself. For IPv4 and
         *    IPv6, this is a string of binary data of the
         *    appropriate length (respectively 4 and 16 bytes)
         *    representing the address in big-endian format, e.g.
         *    7F 00 00 01 means IPv4 localhost. For Unix-domain
         *    sockets, this is the host name of the machine on
         *    which the Unix-domain display resides (so that an
         *    .Xauthority file on a shared file system can contain
         *    authority entries for Unix-domain displays on
         *    several machines without them clashing).
         *
         *  - 'displaynum' is the display number. An empty display
         *    number is a wildcard for any display number.
         *
         *  - 'protoname' is the authorisation protocol, encoded as
         *    its canonical string name (i.e. "MIT-MAGIC-COOKIE-1",
         *    "XDM-AUTHORIZATION-1" or something we don't recognise).
         *
         *  - 'data' is the actual authorisation data, stored in
         *    binary form.
         */

        if (disp->displaynum < 0 ||
            (displaynum >= 0 && disp->displaynum != displaynum))
            continue;                  /* not the one */

        for (protocol = 1; protocol < lenof(x11_authnames); protocol++)
            if (ptrlen_eq_string(protoname, x11_authnames[protocol]))
                break;
        if (protocol == lenof(x11_authnames))
            continue;  /* don't recognise this protocol, look for another */

        switch (family) {
          case 0:   /* IPv4 */
            if (!disp->unixdomain &&
                sk_addrtype(disp->addr) == ADDRTYPE_IPV4) {
                char buf[4];
                sk_addrcopy(disp->addr, buf);
                if (addr.len == 4 && !memcmp(addr.ptr, buf, 4)) {
                    match = true;
                    /* If this is a "localhost" entry, note it down
                     * but carry on looking for a Unix-domain entry. */
                    ideal_match = !localhost;
                }
            }
            break;
          case 6:   /* IPv6 */
            if (!disp->unixdomain &&
                sk_addrtype(disp->addr) == ADDRTYPE_IPV6) {
                char buf[16];
                sk_addrcopy(disp->addr, buf);
                if (addr.len == 16 && !memcmp(addr.ptr, buf, 16)) {
                    match = true;
                    ideal_match = !localhost;
                }
            }
            break;
          case 256: /* Unix-domain / localhost */
            if ((disp->unixdomain || localhost)
                && ourhostname && ptrlen_eq_string(addr, ourhostname)) {
                /* A matching Unix-domain socket is always the best
                 * match. */
                match = true;
                ideal_match = true;
            }
            break;
        }

        if (match) {
            /* Current best guess -- may be overridden if !ideal_match */
            disp->localauthproto = protocol;
            sfree(disp->localauthdata); /* free previous guess, if any */
            disp->localauthdata = snewn(data.len, unsigned char);
            memcpy(disp->localauthdata, data.ptr, data.len);
            disp->localauthdatalen = data.len;
        }
    }

    fclose(authfp);
    smemclr(buf, 2 * MAX_RECORD_SIZE);
    sfree(buf);
    sfree(ourhostname);
}